

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O0

void IKSolver::polyroots2(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  double dVar1;
  IkReal det;
  int *numroots_local;
  IkReal *rawroots_local;
  IkReal *rawcoeffs_local;
  
  dVar1 = rawcoeffs[1] * rawcoeffs[1] + -(*rawcoeffs * 4.0 * rawcoeffs[2]);
  if (0.0 <= dVar1) {
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar1 = IKsqrt(dVar1);
      *rawroots = (-rawcoeffs[1] + dVar1) / (*rawcoeffs * 2.0);
      rawroots[1] = (-rawcoeffs[1] - dVar1) / (*rawcoeffs * 2.0);
      *numroots = 2;
    }
    else {
      *rawroots = (rawcoeffs[1] * -0.5) / *rawcoeffs;
      *numroots = 1;
    }
  }
  else {
    *numroots = 0;
  }
  return;
}

Assistant:

static inline void polyroots2(IkReal rawcoeffs[2+1], IkReal rawroots[2], int& numroots) {
    IkReal det = rawcoeffs[1]*rawcoeffs[1]-4*rawcoeffs[0]*rawcoeffs[2];
    if( det < 0 ) {
        numroots=0;
    }
    else if( det == 0 ) {
        rawroots[0] = -0.5*rawcoeffs[1]/rawcoeffs[0];
        numroots = 1;
    }
    else {
        det = IKsqrt(det);
        rawroots[0] = (-rawcoeffs[1]+det)/(2*rawcoeffs[0]);
        rawroots[1] = (-rawcoeffs[1]-det)/(2*rawcoeffs[0]);//rawcoeffs[2]/(rawcoeffs[0]*rawroots[0]);
        numroots = 2;
    }
}